

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

size_t Open_JTalk_get_sampling_frequency(Open_JTalk *open_jtalk,_Bool *error)

{
  undefined1 *in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (in_RSI != (undefined1 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDI == 0) {
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
    local_8 = 0;
  }
  else {
    local_8 = HTS_Engine_get_sampling_frequency((HTS_Engine *)(in_RDI + 0x50));
  }
  return local_8;
}

Assistant:

size_t Open_JTalk_get_sampling_frequency(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return HTS_Engine_get_sampling_frequency(&open_jtalk->engine);
}